

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O2

input_options * parse_source(input_options *__return_storage_ptr__,vw *all,options_i *options)

{
  string *location;
  input_options *piVar1;
  bool *pbVar2;
  bool bVar3;
  int iVar4;
  option_group_definition *poVar5;
  options_boost_po *this;
  vw_exception *this_00;
  ostream *poVar6;
  allocator local_e67;
  allocator local_e66;
  allocator local_e65;
  allocator local_e64;
  allocator local_e63;
  allocator local_e62;
  allocator local_e61;
  allocator local_e60;
  allocator local_e5f;
  allocator local_e5e;
  allocator local_e5d;
  allocator local_e5c;
  allocator local_e5b;
  allocator local_e5a;
  allocator local_e59;
  allocator local_e58;
  allocator local_e57;
  allocator local_e56;
  allocator local_e55;
  allocator local_e54;
  allocator local_e53;
  allocator local_e52;
  allocator local_e51;
  allocator local_e50;
  allocator local_e4f;
  allocator local_e4e;
  allocator local_e4d;
  allocator local_e4c;
  allocator local_e4b;
  allocator local_e4a;
  allocator local_e49;
  input_options *local_e48;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_e40;
  bool *local_e38;
  string local_e30 [32];
  string local_e10;
  string local_df0 [32];
  string local_dd0;
  string local_db0 [32];
  string local_d90 [32];
  string local_d70;
  string local_d50 [32];
  string local_d30;
  string local_d10 [32];
  string local_cf0;
  string local_cd0 [32];
  string local_cb0;
  string local_c90 [32];
  string local_c70 [32];
  string local_c50;
  string local_c30 [32];
  string local_c10;
  string local_bf0 [32];
  string local_bd0;
  string local_bb0 [32];
  string local_b90;
  string local_b70 [32];
  string local_b50;
  string local_b30 [32];
  string local_b10;
  string local_af0 [32];
  string local_ad0;
  string local_ab0 [32];
  string local_a90 [32];
  string local_a70;
  string local_a50;
  undefined1 local_a30 [160];
  string data;
  string local_960 [32];
  string local_940 [312];
  string local_808;
  option_group_definition input_options;
  undefined1 local_7b0 [160];
  undefined1 local_710 [160];
  undefined1 local_670 [80];
  string local_620 [80];
  undefined1 local_5d0 [80];
  string local_580 [80];
  undefined1 local_530 [160];
  undefined1 local_490 [160];
  undefined1 local_3f0 [160];
  undefined1 local_350 [160];
  undefined1 local_2b0 [160];
  undefined1 local_210 [160];
  undefined1 local_170 [160];
  undefined1 local_d0 [160];
  
  (__return_storage_ptr__->pid_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->pid_file).field_2;
  (__return_storage_ptr__->pid_file)._M_string_length = 0;
  (__return_storage_ptr__->pid_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->port_file)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->port_file).field_2;
  (__return_storage_ptr__->port_file)._M_string_length = 0;
  (__return_storage_ptr__->port_file).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->cache_files).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e48 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)&local_a50,"Input options",(allocator *)&data);
  VW::config::option_group_definition::option_group_definition(&input_options,&local_a50);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::string((string *)&local_a70,"data",&local_e49);
  location = &all->data_filename;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&data,&local_a70,location);
  std::__cxx11::string::string(local_a90,"d",&local_e4a);
  std::__cxx11::string::_M_assign(local_940);
  std::__cxx11::string::string(local_ab0,"Example set",&local_e4b);
  std::__cxx11::string::_M_assign(local_960);
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (&input_options,
                      (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&data);
  std::__cxx11::string::string((string *)&local_ad0,"daemon",&local_e4c);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_a30,&local_ad0,&__return_storage_ptr__->daemon);
  std::__cxx11::string::string(local_af0,"persistent daemon mode on port 26542",&local_e4d);
  std::__cxx11::string::_M_assign((string *)(local_a30 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_a30);
  std::__cxx11::string::string((string *)&local_b10,"foreground",&local_e4e);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_7b0,&local_b10,&__return_storage_ptr__->foreground);
  std::__cxx11::string::string
            (local_b30,"in persistent daemon mode, do not run in the background",&local_e4f);
  std::__cxx11::string::_M_assign((string *)(local_7b0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_7b0);
  std::__cxx11::string::string((string *)&local_b50,"port",&local_e50);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_710,&local_b50,&__return_storage_ptr__->port);
  std::__cxx11::string::string(local_b70,"port to listen on; use 0 to pick unused port",&local_e51);
  std::__cxx11::string::_M_assign((string *)(local_710 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,(typed_option<unsigned_long> *)local_710);
  std::__cxx11::string::string((string *)&local_b90,"num_children",&local_e52);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_490,&local_b90,&all->num_children);
  std::__cxx11::string::string(local_bb0,"number of children for persistent daemon mode",&local_e53)
  ;
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
                     (poVar5,(typed_option<unsigned_long> *)local_490);
  std::__cxx11::string::string((string *)&local_bd0,"pid_file",&local_e54);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_530,&local_bd0,&__return_storage_ptr__->pid_file);
  std::__cxx11::string::string(local_bf0,"Write pid file in persistent daemon mode",&local_e55);
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar5,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_530);
  std::__cxx11::string::string((string *)&local_c10,"port_file",&local_e56);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_c10,&__return_storage_ptr__->port_file);
  std::__cxx11::string::string(local_c30,"Write port used in persistent daemon mode",&local_e57);
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
                     (poVar5,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)local_d0);
  std::__cxx11::string::string((string *)&local_c50,"cache",&local_e58);
  local_e38 = &__return_storage_ptr__->cache;
  VW::config::typed_option<bool>::typed_option((typed_option<bool> *)local_5d0,&local_c50,local_e38)
  ;
  std::__cxx11::string::string(local_c70,"c",&local_e59);
  std::__cxx11::string::_M_assign(local_580);
  std::__cxx11::string::string(local_c90,"Use a cache.  The default is <data>.cache",&local_e5a);
  std::__cxx11::string::_M_assign((string *)(local_5d0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_5d0);
  std::__cxx11::string::string((string *)&local_cb0,"cache_file",&local_e5b);
  local_e40 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
              &__return_storage_ptr__->cache_files;
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_170,&local_cb0,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_e40);
  std::__cxx11::string::string(local_cd0,"The location(s) of cache_file.",&local_e5c);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar5 = VW::config::option_group_definition::
           add<VW::config::typed_option<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>&>
                     (poVar5,(typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_170);
  std::__cxx11::string::string((string *)&local_cf0,"json",&local_e5d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_210,&local_cf0,&__return_storage_ptr__->json);
  std::__cxx11::string::string(local_d10,"Enable JSON parsing.",&local_e5e);
  std::__cxx11::string::_M_assign((string *)(local_210 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_210);
  std::__cxx11::string::string((string *)&local_d30,"dsjson",&local_e5f);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_2b0,&local_d30,&__return_storage_ptr__->dsjson);
  std::__cxx11::string::string(local_d50,"Enable Decision Service JSON parsing.",&local_e60);
  std::__cxx11::string::_M_assign((string *)(local_2b0 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_2b0);
  std::__cxx11::string::string((string *)&local_d70,"kill_cache",&local_e61);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_670,&local_d70,&__return_storage_ptr__->kill_cache);
  std::__cxx11::string::string(local_d90,"k",&local_e62);
  std::__cxx11::string::_M_assign(local_620);
  std::__cxx11::string::string
            (local_db0,"do not reuse existing cache: create a new one always",&local_e63);
  std::__cxx11::string::_M_assign((string *)(local_670 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_670);
  std::__cxx11::string::string((string *)&local_dd0,"compressed",&local_e64);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_350,&local_dd0,&__return_storage_ptr__->compressed);
  std::__cxx11::string::string
            (local_df0,
             "use gzip format whenever possible. If a cache file is being created, this option creates a compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."
             ,&local_e65);
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_350);
  std::__cxx11::string::string((string *)&local_e10,"no_stdin",&local_e66);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_e10,&all->stdin_off);
  std::__cxx11::string::string(local_e30,"do not default to reading from stdin",&local_e67);
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (poVar5,(typed_option<bool> *)local_3f0);
  std::__cxx11::string::~string(local_e30);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3f0);
  std::__cxx11::string::~string((string *)&local_e10);
  std::__cxx11::string::~string(local_df0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_350);
  std::__cxx11::string::~string((string *)&local_dd0);
  std::__cxx11::string::~string(local_db0);
  std::__cxx11::string::~string(local_d90);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_670);
  std::__cxx11::string::~string((string *)&local_d70);
  std::__cxx11::string::~string(local_d50);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_2b0);
  std::__cxx11::string::~string((string *)&local_d30);
  std::__cxx11::string::~string(local_d10);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_210);
  std::__cxx11::string::~string((string *)&local_cf0);
  std::__cxx11::string::~string(local_cd0);
  VW::config::
  typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~typed_option((typed_option<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_170);
  std::__cxx11::string::~string((string *)&local_cb0);
  std::__cxx11::string::~string(local_c90);
  std::__cxx11::string::~string(local_c70);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5d0);
  std::__cxx11::string::~string((string *)&local_c50);
  std::__cxx11::string::~string(local_c30);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_d0);
  std::__cxx11::string::~string((string *)&local_c10);
  std::__cxx11::string::~string(local_bf0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_530);
  std::__cxx11::string::~string((string *)&local_bd0);
  std::__cxx11::string::~string(local_bb0);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_490);
  std::__cxx11::string::~string((string *)&local_b90);
  std::__cxx11::string::~string(local_b70);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_710);
  std::__cxx11::string::~string((string *)&local_b50);
  std::__cxx11::string::~string(local_b30);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_7b0);
  std::__cxx11::string::~string((string *)&local_b10);
  std::__cxx11::string::~string(local_af0);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_a30);
  std::__cxx11::string::~string((string *)&local_ad0);
  std::__cxx11::string::~string(local_ab0);
  std::__cxx11::string::~string(local_a90);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&data);
  std::__cxx11::string::~string((string *)&local_a70);
  (**options->_vptr_options_i)(options,&input_options);
  this = (options_boost_po *)
         __dynamic_cast(options,&VW::config::options_i::typeinfo,
                        &VW::config::options_boost_po::typeinfo,0);
  if (this != (options_boost_po *)0x0) {
    data._M_dataplus._M_p = (pointer)&data.field_2;
    data._M_string_length = 0;
    data.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)local_a30,"data",(allocator *)local_7b0);
    bVar3 = VW::config::options_boost_po::try_get_positional_option_token
                      (this,(string *)local_a30,&data,-1);
    std::__cxx11::string::~string((string *)local_a30);
    if (bVar3) {
      bVar3 = std::operator!=(location,&data);
      if (bVar3) {
        std::__cxx11::string::_M_assign((string *)location);
      }
    }
    std::__cxx11::string::~string((string *)&data);
  }
  if (local_e48->daemon == false) {
    std::__cxx11::string::string((string *)&data,"pid_file",(allocator *)local_7b0);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    if ((char)iVar4 != '\0') {
      std::__cxx11::string::~string((string *)&data);
      goto LAB_0011cb65;
    }
    std::__cxx11::string::string((string *)local_a30,"port",(allocator *)local_710);
    iVar4 = (*options->_vptr_options_i[1])(options,local_a30);
    bVar3 = all->active;
    std::__cxx11::string::~string((string *)local_a30);
    std::__cxx11::string::~string((string *)&data);
    if (((char)iVar4 != '\0') && ((bVar3 & 1U) == 0)) goto LAB_0011cb65;
  }
  else {
LAB_0011cb65:
    all->daemon = true;
    all->numpasses = 100000;
  }
  pbVar2 = local_e38;
  if (*local_e38 == true) {
    std::operator+(&data,location,".cache");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_e40,&data);
    std::__cxx11::string::~string((string *)&data);
  }
  piVar1 = local_e48;
  if (__return_storage_ptr__->compressed == true) {
    set_compressed(all->p);
  }
  std::__cxx11::string::string((string *)&data,".gz",(allocator *)local_a30);
  bVar3 = ends_with(location,&data);
  std::__cxx11::string::~string((string *)&data);
  if (bVar3) {
    set_compressed(all->p);
  }
  bVar3 = *pbVar2;
  if (bVar3 == false) {
    std::__cxx11::string::string((string *)local_a30,"cache_file",(allocator *)local_710);
    iVar4 = (*options->_vptr_options_i[1])(options,local_a30);
    if ((char)iVar4 != '\0') goto LAB_0011cc54;
    std::__cxx11::string::~string((string *)local_a30);
  }
  else {
LAB_0011cc54:
    std::__cxx11::string::string((string *)&data,"invert_hash",(allocator *)local_7b0);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    std::__cxx11::string::~string((string *)&data);
    if (bVar3 == false) {
      std::__cxx11::string::~string((string *)local_a30);
    }
    if ((char)iVar4 != '\0') {
      std::__cxx11::stringstream::stringstream((stringstream *)&data);
      std::operator<<((ostream *)&data.field_2,
                      "invert_hash is incompatible with a cache file.  Use it in single pass mode only."
                     );
      this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
      std::__cxx11::stringbuf::str();
      VW::vw_exception::vw_exception
                (this_00,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/parse_args.cc"
                 ,0x1d8,&local_808);
      __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
  }
  if (all->holdout_set_off == false) {
    std::__cxx11::string::string
              ((string *)&data,"output_feature_regularizer_binary",(allocator *)local_490);
    iVar4 = (*options->_vptr_options_i[1])(options,&data);
    if ((char)iVar4 == '\0') {
      std::__cxx11::string::string
                ((string *)local_7b0,"output_feature_regularizer_text",(allocator *)local_530);
      iVar4 = (*options->_vptr_options_i[1])(options,local_7b0);
      std::__cxx11::string::~string((string *)local_7b0);
      std::__cxx11::string::~string((string *)&data);
      if ((char)iVar4 == '\0') goto LAB_0011cdf2;
    }
    else {
      std::__cxx11::string::~string((string *)&data);
    }
    all->holdout_set_off = true;
    poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                             "Making holdout_set_off=true since output regularizer specified");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
LAB_0011cdf2:
  VW::config::option_group_definition::~option_group_definition(&input_options);
  return piVar1;
}

Assistant:

input_options parse_source(vw& all, options_i& options)
{
  input_options parsed_options;

  option_group_definition input_options("Input options");
  input_options.add(make_option("data", all.data_filename).short_name("d").help("Example set"))
      .add(make_option("daemon", parsed_options.daemon).help("persistent daemon mode on port 26542"))
      .add(make_option("foreground", parsed_options.foreground)
               .help("in persistent daemon mode, do not run in the background"))
      .add(make_option("port", parsed_options.port).help("port to listen on; use 0 to pick unused port"))
      .add(make_option("num_children", all.num_children).help("number of children for persistent daemon mode"))
      .add(make_option("pid_file", parsed_options.pid_file).help("Write pid file in persistent daemon mode"))
      .add(make_option("port_file", parsed_options.port_file).help("Write port used in persistent daemon mode"))
      .add(make_option("cache", parsed_options.cache).short_name("c").help("Use a cache.  The default is <data>.cache"))
      .add(make_option("cache_file", parsed_options.cache_files).help("The location(s) of cache_file."))
      .add(make_option("json", parsed_options.json).help("Enable JSON parsing."))
      .add(make_option("dsjson", parsed_options.dsjson).help("Enable Decision Service JSON parsing."))
      .add(make_option("kill_cache", parsed_options.kill_cache)
               .short_name("k")
               .help("do not reuse existing cache: create a new one always"))
      .add(
          make_option("compressed", parsed_options.compressed)
              .help(
                  "use gzip format whenever possible. If a cache file is being created, this option creates a "
                  "compressed cache file. A mixture of raw-text & compressed inputs are supported with autodetection."))
      .add(make_option("no_stdin", all.stdin_off).help("do not default to reading from stdin"));

  options.add_and_parse(input_options);

  // If the option provider is program_options try and retrieve data as a positional parameter.
  options_i* options_ptr = &options;
  auto boost_options = dynamic_cast<options_boost_po*>(options_ptr);
  if (boost_options)
  {
    std::string data;
    if (boost_options->try_get_positional_option_token("data", data, -1))
    {
      if (all.data_filename != data)
      {
        all.data_filename = data;
      }
    }
  }

  if (parsed_options.daemon || options.was_supplied("pid_file") || (options.was_supplied("port") && !all.active))
  {
    all.daemon = true;
    // allow each child to process up to 1e5 connections
    all.numpasses = (size_t)1e5;
  }

  // Add an implicit cache file based on the data filename.
  if (parsed_options.cache)
  {
    parsed_options.cache_files.push_back(all.data_filename + ".cache");
  }

  if (parsed_options.compressed)
    set_compressed(all.p);

  if (ends_with(all.data_filename, ".gz"))
    set_compressed(all.p);

  if ((parsed_options.cache || options.was_supplied("cache_file")) && options.was_supplied("invert_hash"))
    THROW("invert_hash is incompatible with a cache file.  Use it in single pass mode only.");

  if (!all.holdout_set_off &&
      (options.was_supplied("output_feature_regularizer_binary") ||
          options.was_supplied("output_feature_regularizer_text")))
  {
    all.holdout_set_off = true;
    all.trace_message << "Making holdout_set_off=true since output regularizer specified" << endl;
  }

  return parsed_options;
}